

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O2

void __thiscall Diligent::GLContextState::SetFillMode(GLContextState *this,FILL_MODE FillMode)

{
  GLenum err;
  string msg;
  
  if ((this->m_Caps).IsFillModeSelectionSupported == true) {
    if ((this->m_RSState).FillMode != FillMode) {
      glPolygonMode(0x408,(FillMode != FILL_MODE_WIREFRAME) + 0x1b01);
      err = glGetError();
      if (err != 0) {
        LogError<false,char[27],char[17],unsigned_int>
                  (false,"SetFillMode",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x24b,(char (*) [27])"Failed to set polygon mode",
                   (char (*) [17])"\nGL Error Code: ",&err);
        FormatString<char[6]>(&msg,(char (*) [6])0x731c01);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"SetFillMode",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x24b);
        std::__cxx11::string::~string((string *)&msg);
      }
      (this->m_RSState).FillMode = FillMode;
    }
  }
  else if (FillMode == FILL_MODE_WIREFRAME) {
    FormatString<char[53]>
              (&msg,(char (*) [53])"Wireframe fill mode is not supported on this device\n");
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void GLContextState::SetFillMode(FILL_MODE FillMode)
{
    if (m_Caps.IsFillModeSelectionSupported)
    {
        if (m_RSState.FillMode != FillMode)
        {
            if (glPolygonMode != nullptr)
            {
                GLenum PolygonMode = FillMode == FILL_MODE_WIREFRAME ? GL_LINE : GL_FILL;
                glPolygonMode(GL_FRONT_AND_BACK, PolygonMode);
                DEV_CHECK_GL_ERROR("Failed to set polygon mode");
            }
            else
            {
                if (FillMode != FILL_MODE_SOLID)
                    LOG_ERROR("This API/device only supports solid fill mode");
            }

            m_RSState.FillMode = FillMode;
        }
    }
    else
    {
        if (FillMode == FILL_MODE_WIREFRAME)
            LOG_WARNING_MESSAGE("Wireframe fill mode is not supported on this device\n");
    }
}